

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Get_proc_index(int g_a,int iproc,int *index)

{
  Integer IVar1;
  Integer *pIVar2;
  Integer _ga_work [7];
  Integer local_68 [8];
  
  pIVar2 = local_68;
  IVar1 = pnga_get_dimension((long)g_a);
  pnga_get_proc_index((long)g_a,(long)iproc,local_68);
  if (0 < IVar1) {
    do {
      index[IVar1 + -1] = *(int *)pIVar2;
      pIVar2 = (Integer *)((long)pIVar2 + 8);
      IVar1 = IVar1 + -1;
    } while (IVar1 != 0);
  }
  return;
}

Assistant:

void NGA_Get_proc_index(int g_a, int iproc, int index[])
{
     Integer aa, proc, ndim;
     Integer _ga_work[MAXDIM];
     aa = (Integer)g_a;
     proc = (Integer)iproc;
     ndim = wnga_get_dimension(aa);
     wnga_get_proc_index(aa, proc, _ga_work);
     COPYF2C(_ga_work,index, ndim);
}